

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::form::add(form *this,form *subform)

{
  vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
  *this_00;
  long *in_RSI;
  long in_RDI;
  value_type *in_stack_ffffffffffffffb8;
  bool local_29;
  form *local_28;
  pair<cppcms::base_form_*,_bool> local_20;
  long *local_10;
  
  this_00 = (vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
             *)(in_RDI + 8);
  local_29 = false;
  local_10 = in_RSI;
  std::pair<cppcms::base_form_*,_bool>::pair<cppcms::form_*,_bool,_true>
            (&local_20,&local_28,&local_29);
  std::
  vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
  ::push_back(this_00,in_stack_ffffffffffffffb8);
  (**(code **)(*local_10 + 0x20))(local_10,in_RDI);
  return;
}

Assistant:

void form::add(form &subform)
{
	elements_.push_back(widget_type(&subform,false));
	subform.parent(this);
}